

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CColorConverter.cpp
# Opt level: O3

void irr::video::CColorConverter::convert8BitTo24Bit
               (u8 *in,u8 *out,s32 width,s32 height,u8 *palette,s32 linepad,bool flip)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  u8 *puVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  byte *pbVar10;
  
  if (0 < height && (out != (u8 *)0x0 && in != (u8 *)0x0)) {
    uVar4 = (ulong)(width * 3);
    uVar8 = 0;
    uVar9 = uVar4;
    uVar2 = uVar8;
    uVar3 = uVar8;
    if (flip) {
      uVar9 = uVar8;
      uVar2 = (long)(width * 3 * height);
      uVar3 = -uVar4;
    }
    puVar6 = out + uVar2 + uVar3 + 2;
    do {
      if (0 < width) {
        lVar5 = 0;
        do {
          bVar1 = *in;
          if (palette == (u8 *)0x0) {
            puVar6[lVar5 + -2] = bVar1;
            puVar6[lVar5 + -1] = bVar1;
            pbVar10 = in;
          }
          else {
            puVar6[lVar5 + -2] = palette[(ulong)bVar1 * 4 + 2];
            puVar6[lVar5 + -1] = palette[(ulong)*in * 4 + 1];
            pbVar10 = palette + (ulong)*in * 4;
          }
          puVar6[lVar5] = *pbVar10;
          in = in + 1;
          lVar5 = lVar5 + 3;
        } while (lVar5 < (long)uVar4);
      }
      in = in + linepad;
      uVar7 = (int)uVar8 + 1;
      uVar8 = (ulong)uVar7;
      puVar6 = puVar6 + uVar9 + uVar3;
    } while (uVar7 != height);
  }
  return;
}

Assistant:

void CColorConverter::convert8BitTo24Bit(const u8 *in, u8 *out, s32 width, s32 height, const u8 *palette, s32 linepad, bool flip)
{
	if (!in || !out)
		return;

	const s32 lineWidth = 3 * width;
	if (flip)
		out += lineWidth * height;

	for (s32 y = 0; y < height; ++y) {
		if (flip)
			out -= lineWidth; // one line back
		for (s32 x = 0; x < lineWidth; x += 3) {
			if (palette) {
#ifdef __BIG_ENDIAN__
				out[x + 0] = palette[(in[0] << 2) + 0];
				out[x + 1] = palette[(in[0] << 2) + 1];
				out[x + 2] = palette[(in[0] << 2) + 2];
#else
				out[x + 0] = palette[(in[0] << 2) + 2];
				out[x + 1] = palette[(in[0] << 2) + 1];
				out[x + 2] = palette[(in[0] << 2) + 0];
#endif
			} else {
				out[x + 0] = in[0];
				out[x + 1] = in[0];
				out[x + 2] = in[0];
			}
			++in;
		}
		if (!flip)
			out += lineWidth;
		in += linepad;
	}
}